

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qssldiffiehellmanparameters_openssl.cpp
# Opt level: O2

int __thiscall
QTlsBackendOpenSSL::dhParametersFromDer
          (QTlsBackendOpenSSL *this,QByteArray *der,QByteArray *derData)

{
  long lVar1;
  bool bVar2;
  DH *dh;
  int iVar3;
  long in_FS_OFFSET;
  uchar *data;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (der->d).size;
  if (lVar1 != 0) {
    data = (uchar *)(der->d).ptr;
    if (data == (uchar *)0x0) {
      data = (uchar *)&QByteArray::_empty;
    }
    QSslSocketPrivate::ensureInitialized();
    dh = q_d2i_DHparams((DH **)0x0,&data,(long)(int)lVar1);
    if (dh != (DH *)0x0) {
      bVar2 = anon_unknown.dwarf_1495ef::isSafeDH(dh);
      if (bVar2) {
        QByteArray::operator=(derData,der);
        iVar3 = 0;
      }
      else {
        iVar3 = 2;
      }
      q_DH_free(dh);
      goto LAB_00128191;
    }
  }
  iVar3 = 1;
LAB_00128191:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QTlsBackendOpenSSL::dhParametersFromDer(const QByteArray &der, QByteArray *derData) const
{
#ifndef OPENSSL_NO_DEPRECATED_3_0
    Q_ASSERT(derData);

    if (der.isEmpty())
        return DHParams::InvalidInputDataError;

    const unsigned char *data = reinterpret_cast<const unsigned char *>(der.data());
    const int len = der.size();

    // TLSTODO: check it's needed (loading ciphers and certs in
    // addition to the library!)
    QSslSocketPrivate::ensureInitialized();

    DH *dh = q_d2i_DHparams(nullptr, &data, len);
    if (dh) {
        const auto dhRaii = qScopeGuard([dh] {q_DH_free(dh);});

        if (isSafeDH(dh))
            *derData = der;
        else
            return DHParams::UnsafeParametersError;
    } else {
        return DHParams::InvalidInputDataError;
    }
#else
    Q_UNUSED(der);
    Q_UNUSED(derData);
    qCWarning(lcTlsBackend, "Diffie-Hellman parameters are not supported, because OpenSSL v3 was built with deprecated API removed");
#endif
    return DHParams::NoError;
}